

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow_p.h
# Opt level: O0

void __thiscall
QMdi::ControlElement<QMdi::ControlLabel>::~ControlElement(ControlElement<QMdi::ControlLabel> *this)

{
  ControlElement<QMdi::ControlLabel> *in_stack_00000010;
  
  ~ControlElement(in_stack_00000010);
  return;
}

Assistant:

ControlElement(QMdiSubWindow *child) : T(nullptr)
    {
        Q_ASSERT(child);
        mdiChild = child;
    }